

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor_test.cpp
# Opt level: O0

void __thiscall
preprocessor_test_foreach_empty_Test::TestBody(preprocessor_test_foreach_empty_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  AssertHelper in_stack_ffffffffffffffc0;
  Message in_stack_ffffffffffffffc8;
  AssertionResult local_18;
  
  this_00 = &local_18;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffffc8.ss_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,(char *)in_stack_ffffffffffffffc0.data_,
             (int *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),(int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc8);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x1104b4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x92,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc0,(Message *)&stack0xffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc0);
    testing::Message::~Message((Message *)0x110500);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x110540);
  return;
}

Assistant:

TEST_F(preprocessor_test, foreach_empty)
{
#define PREPROCESSOR_TEST_FOR_EACH(expr) "33434"

	EXPECT_EQ((int)1, (int)PREPROCESSOR_ARGS_EMPTY(PREPROCESSOR_FOR_EACH(PREPROCESSOR_TEST_FOR_EACH)));

#undef PREPROCESSOR_TEST_FOR_EACH
}